

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

void ImGui::SetCursorPosY(float y)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  uint uVar3;
  float fVar4;
  
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  fVar1 = (pIVar2->DC).CursorMaxPos.y;
  fVar4 = ((pIVar2->Pos).y - (pIVar2->Scroll).y) + y;
  (pIVar2->DC).CursorPos.y = fVar4;
  uVar3 = -(uint)(fVar4 <= fVar1);
  (pIVar2->DC).CursorMaxPos.y = (float)(uVar3 & (uint)fVar1 | ~uVar3 & (uint)fVar4);
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }